

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

bool slang::ast::builtins::isComparable(Type *type)

{
  bool bVar1;
  
  bVar1 = Type::isNumeric(type);
  if (bVar1) {
    return true;
  }
  bVar1 = Type::isString(type);
  return bVar1;
}

Assistant:

static bool isComparable(const Type& type) {
    return type.isNumeric() || type.isString();
}